

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O2

void duckdb::MinOperation::Combine<duckdb::MinMaxState<double>,duckdb::MinOperation>
               (MinMaxState<double> *source,MinMaxState<double> *target,AggregateInputData *param_3)

{
  undefined7 uVar1;
  bool bVar2;
  
  if (source->isset == true) {
    if (target->isset == false) {
      bVar2 = source->isset;
      uVar1 = *(undefined7 *)&source->field_0x9;
      target->value = source->value;
      target->isset = bVar2;
      *(undefined7 *)&target->field_0x9 = uVar1;
    }
    else {
      bVar2 = GreaterThan::Operation<double>(&target->value,&source->value);
      if (bVar2) {
        target->value = source->value;
      }
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.isset) {
			// source is NULL, nothing to do
			return;
		}
		if (!target.isset) {
			// target is NULL, use source value directly
			target = source;
		} else if (GreaterThan::Operation(target.value, source.value)) {
			target.value = source.value;
		}
	}